

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O2

CordRep * absl::lts_20250127::cord_internal::anon_unknown_10::Substring
                    (CordRep *rep,size_t offset,size_t n)

{
  ulong uVar1;
  uint __line;
  bool bVar2;
  byte bVar3;
  CordRepSubstring *pCVar4;
  CordRep *pCVar5;
  char *__assertion;
  
  uVar1 = rep->length;
  if (uVar1 < n) {
    __assertion = "n <= rep->length";
    __line = 0x28;
  }
  else if (offset < uVar1) {
    if (uVar1 - n < offset) {
      __assertion = "offset <= rep->length - n";
      __line = 0x2a;
    }
    else {
      bVar2 = IsDataEdge(rep);
      if (bVar2) {
        if (n == 0) {
          rep = (CordRep *)0x0;
        }
        else if (rep->length == n) {
          LOCK();
          (rep->refcount).count_.super___atomic_base<int>._M_i =
               (rep->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
        }
        else {
          bVar3 = rep->tag;
          pCVar5 = rep;
          if (bVar3 == 1) {
            pCVar4 = CordRep::substring(rep);
            offset = offset + pCVar4->start;
            pCVar4 = CordRep::substring(rep);
            pCVar5 = pCVar4->child;
            bVar3 = pCVar5->tag;
          }
          if (bVar3 < 5) {
            __assertion = "rep->IsExternal() || rep->IsFlat()";
            __line = 0x35;
            goto LAB_00274785;
          }
          rep = (CordRep *)operator_new(0x20);
          rep->length = 0;
          rep->refcount = (atomic<int>)0x0;
          rep->tag = '\0';
          rep->storage[0] = '\0';
          rep->storage[1] = '\0';
          rep->storage[2] = '\0';
          (rep->refcount).count_.super___atomic_base<int>._M_i = 2;
          rep->length = n;
          rep->tag = '\x01';
          rep[1].length = offset;
          LOCK();
          (pCVar5->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar5->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
          *(CordRep **)&rep[1].refcount = pCVar5;
        }
        return rep;
      }
      __assertion = "IsDataEdge(rep)";
      __line = 0x2b;
    }
  }
  else {
    __assertion = "offset < rep->length";
    __line = 0x29;
  }
LAB_00274785:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                ,__line,
                "CordRep *absl::cord_internal::(anonymous namespace)::Substring(CordRep *, size_t, size_t)"
               );
}

Assistant:

inline CordRep* Substring(CordRep* rep, size_t offset, size_t n) {
  assert(n <= rep->length);
  assert(offset < rep->length);
  assert(offset <= rep->length - n);
  assert(IsDataEdge(rep));

  if (n == 0) return nullptr;
  if (n == rep->length) return CordRep::Ref(rep);

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = rep->substring()->child;
  }

  assert(rep->IsExternal() || rep->IsFlat());
  CordRepSubstring* substring = new CordRepSubstring();
  substring->length = n;
  substring->tag = SUBSTRING;
  substring->start = offset;
  substring->child = CordRep::Ref(rep);
  return substring;
}